

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::setVolumeDensity(btSoftBody *this,btScalar density)

{
  int iVar1;
  Tetra *pTVar2;
  long in_RDI;
  int j;
  Tetra *t;
  int i;
  btScalar volume;
  btScalar in_stack_0000008c;
  btSoftBody *in_stack_00000090;
  int local_24;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    iVar1 = btAlignedObjectArray<btSoftBody::Tetra>::size
                      ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0));
    if (iVar1 <= local_14) break;
    pTVar2 = btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),local_14);
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      btFabs(pTVar2->m_rv);
    }
    local_14 = local_14 + 1;
  }
  setVolumeMass(in_stack_00000090,in_stack_0000008c);
  return;
}

Assistant:

void			btSoftBody::setVolumeDensity(btScalar density)
{
btScalar	volume=0;
for(int i=0;i<m_tetras.size();++i)
	{
	const Tetra& t=m_tetras[i];
	for(int j=0;j<4;++j)
		{
		volume+=btFabs(t.m_rv);
		}
	}
setVolumeMass(volume*density/6);
}